

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMeshAddTag(FmsMesh mesh,char *tag_name,FmsTag *tag)

{
  ulong uVar1;
  int iVar2;
  char *str;
  char **str_copy_p;
  undefined8 *in_RDX;
  long in_RDI;
  FmsTag t;
  FmsInt nc;
  FmsTag *tags;
  FmsInt num_tags;
  void *local_30;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RDX == (undefined8 *)0x0) {
    local_4 = 2;
  }
  else {
    uVar1 = *(ulong *)(in_RDI + 0x10);
    local_30 = *(void **)(in_RDI + 0x38);
    str = (char *)NextPow2(uVar1 + 1);
    if (uVar1 <= (ulong)str >> 1) {
      local_30 = realloc(local_30,(long)str << 3);
      if (local_30 == (void *)0x0) {
        return 3;
      }
      *(void **)(in_RDI + 0x38) = local_30;
    }
    str_copy_p = (char **)calloc(1,0x38);
    if (str_copy_p == (char **)0x0) {
      local_4 = 3;
    }
    else {
      iVar2 = FmsCopyString(str,str_copy_p);
      if (iVar2 == 0) {
        *(undefined4 *)(str_copy_p + 3) = 8;
        *(char ***)((long)local_30 + uVar1 * 8) = str_copy_p;
        *(ulong *)(in_RDI + 0x10) = uVar1 + 1;
        *in_RDX = str_copy_p;
        local_4 = 0;
      }
      else {
        free(str_copy_p);
        local_4 = 3;
      }
    }
  }
  return local_4;
}

Assistant:

int FmsMeshAddTag(FmsMesh mesh, const char *tag_name, FmsTag *tag) {
  if (!mesh) { E_RETURN(1); }
  if (!tag) { E_RETURN(2); }
  FmsInt num_tags = mesh->num_tags;
  FmsTag *tags = mesh->tags;
  // Reallocate mesh->tags, if necessary
  FmsInt nc = NextPow2(num_tags+1);
  if (num_tags <= nc/2) {
    tags = realloc(tags, nc*sizeof(*tags));
    if (tags == NULL) { E_RETURN(3); }
    mesh->tags = tags;
  }
  FmsTag t;
  t = calloc(1, sizeof(*t));
  if (t == NULL) { E_RETURN(3); }
  // On error, call free(t)
  if (FmsCopyString(tag_name, &t->name)) { free(t); E_RETURN(3); }
  t->tag_type = FMS_NUM_INT_TYPES; // invalid type
  tags[num_tags] = t;
  mesh->num_tags = num_tags+1;
  *tag = t;
  return 0;
}